

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  Descriptor *descriptor;
  ImmutableMessageLiteGenerator local_90;
  int local_20;
  int local_1c;
  int i;
  int bytecode_estimate;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_1c = 0;
  local_20 = 0;
  _i = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar2 = local_20;
    iVar1 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar1 <= iVar2) break;
    descriptor = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_20);
    ImmutableMessageLiteGenerator(&local_90,descriptor,this->context_);
    iVar2 = GenerateStaticVariableInitializers(&local_90,_i);
    local_1c = iVar2 + local_1c;
    ~ImmutableMessageLiteGenerator(&local_90);
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

int ImmutableMessageLiteGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    bytecode_estimate +=
        ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
            .GenerateStaticVariableInitializers(printer);
  }
  return bytecode_estimate;
}